

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

void __thiscall
boost::exception_detail::clone_impl<boost::exception_detail::bad_exception_>::clone_impl
          (clone_impl<boost::exception_detail::bad_exception_> *this,bad_exception_ *x)

{
  bad_exception_ *in_RDI;
  exception *in_stack_00000008;
  exception *in_stack_00000010;
  bad_exception_ *in_stack_ffffffffffffffe0;
  
  clone_base::clone_base((clone_base *)(in_RDI + 1));
  bad_exception_::bad_exception_(in_stack_ffffffffffffffe0,in_RDI);
  (in_RDI->super_exception)._vptr_exception = (_func_int **)0x13a5b0;
  *(undefined8 *)&in_RDI->super_bad_exception = 0x13a5e0;
  in_RDI[1].super_exception._vptr_exception = (_func_int **)0x13a620;
  copy_boost_exception(in_stack_00000010,in_stack_00000008);
  return;
}

Assistant:

explicit
            clone_impl( T const & x ):
                T(x)
                {
                copy_boost_exception(this,&x);
                }